

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O1

spv_result_t
spvtools::val::anon_unknown_2::ValidateBinaryUsingContextAndValidationState
          (spv_context_t *context,uint32_t *words,size_t num_words,spv_diagnostic *pDiagnostic,
          ValidationState_t *vstate)

{
  uint uVar1;
  _Manager_type p_Var2;
  Instruction *pIVar3;
  spv_position_t position;
  spv_position_t position_00;
  spv_position_t position_01;
  spv_position_t position_02;
  iterator iVar4;
  spv_result_t sVar5;
  uint32_t uVar6;
  uint uVar7;
  ExecutionModel EVar8;
  int iVar9;
  spv_result_t sVar10;
  spv_const_binary binary;
  DiagnosticStream *pDVar11;
  undefined4 extraout_var;
  Function *pFVar12;
  BasicBlock *pBVar13;
  pointer psVar14;
  long lVar15;
  Instruction *inst_00;
  ulong uVar16;
  char *pcVar17;
  Instruction *inst_1;
  pointer pIVar18;
  Instruction *pIVar19;
  byte bVar20;
  pointer pIVar21;
  ValidationState_t *_;
  Instruction **ppIVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  Instruction *inst;
  spv_endianness_t endian;
  vector<spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>_>
  visited_entry_points;
  spv_context_t hijacked_context;
  EntryPointDescription desc;
  string check_name;
  string desc_name;
  spv_header_t header;
  spv_result_t local_3dc;
  Instruction *local_3c8;
  pointer local_3c0;
  undefined8 local_3b8;
  spv_const_binary local_3b0;
  undefined8 local_3a8;
  undefined8 local_3a0;
  Instruction *local_398;
  spv_endianness_t local_38c;
  Instruction **local_388;
  iterator iStack_380;
  Instruction **local_378;
  undefined1 local_368 [32];
  _Any_data local_348;
  _Manager_type local_338;
  _Invoker_type p_Stack_330;
  EntryPointDescription local_320;
  string local_2e8;
  string local_2c8;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  size_t local_298;
  undefined8 local_288;
  undefined8 uStack_280;
  size_t local_278;
  undefined8 local_268;
  undefined8 uStack_260;
  size_t local_258;
  undefined8 local_248;
  undefined8 uStack_240;
  size_t local_238;
  spv_header_t local_228;
  _Any_data local_208;
  _Manager_type local_1f8;
  _Invoker_type local_1f0;
  spv_result_t local_38;
  
  binary = (spv_const_binary)operator_new(0x10);
  binary->code = words;
  binary->wordCount = num_words;
  sVar5 = spvBinaryEndianness(binary,&local_38c);
  if (sVar5 == SPV_SUCCESS) {
    sVar5 = spvBinaryHeaderGet(binary,local_38c,&local_228);
    if (sVar5 == SPV_SUCCESS) {
      uVar6 = spvVersionForTargetEnv(context->target_env);
      if (uVar6 < local_228.version) {
        local_288 = 0;
        uStack_280 = 0;
        local_278 = 0;
        local_368._0_8_ = local_368 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"");
        position_01.column = uStack_280;
        position_01.line = local_288;
        position_01.index = local_278;
        DiagnosticStream::DiagnosticStream
                  ((DiagnosticStream *)&local_208,position_01,&context->consumer,(string *)local_368
                   ,SPV_ERROR_WRONG_VERSION);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208._M_pod_data,"Invalid SPIR-V binary version ",0x1e);
        std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208._M_pod_data,".",1);
        std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208._M_pod_data," for target environment ",0x18);
        local_320.name._M_dataplus._M_p = spvTargetEnvDescription(context->target_env);
        pDVar11 = DiagnosticStream::operator<<((DiagnosticStream *)&local_208,(char **)&local_320);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar11,".",1);
        sVar5 = pDVar11->error_;
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_208);
        if ((undefined1 *)local_368._0_8_ != local_368 + 0x10) {
          operator_delete((void *)local_368._0_8_,(ulong)(local_368._16_8_ + 1));
        }
        goto LAB_00634270;
      }
      if ((vstate->options_->universal_limits_).max_id_bound < local_228.bound) {
        local_2a8 = 0;
        uStack_2a0 = 0;
        local_298 = 0;
        local_368._0_8_ = local_368 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"");
        position_02.column = uStack_2a0;
        position_02.line = local_2a8;
        position_02.index = local_298;
        DiagnosticStream::DiagnosticStream
                  ((DiagnosticStream *)&local_208,position_02,&context->consumer,(string *)local_368
                   ,SPV_ERROR_INVALID_BINARY);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208._M_pod_data,
                   "Invalid SPIR-V.  The id bound is larger than the max id bound ",0x3e);
        std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208._M_pod_data,".",1);
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_208);
        sVar5 = local_38;
        if ((undefined1 *)local_368._0_8_ != local_368 + 0x10) {
          operator_delete((void *)local_368._0_8_,(ulong)(local_368._16_8_ + 1));
        }
        goto LAB_00634270;
      }
      local_368._0_8_ = *(undefined8 *)context;
      local_368._8_4_ = *(undefined4 *)&context->opcode_table;
      local_368._12_4_ = *(undefined4 *)((long)&context->opcode_table + 4);
      local_368._16_8_ = context->operand_table;
      local_368._24_8_ = context->ext_inst_table;
      local_348._M_unused._M_object = (void *)0x0;
      local_348._8_8_ = 0;
      local_338 = (_Manager_type)0x0;
      p_Stack_330 = (_Invoker_type)0x0;
      p_Var2 = (context->consumer).super__Function_base._M_manager;
      if (p_Var2 != (_Manager_type)0x0) {
        (*p_Var2)(&local_348,(_Any_data *)&context->consumer,__clone_functor);
        p_Stack_330 = (context->consumer)._M_invoker;
        local_338 = (context->consumer).super__Function_base._M_manager;
      }
      p_Var2 = local_338;
      local_208._M_unused._M_object = local_348._M_unused._M_object;
      local_208._8_8_ = local_348._8_8_;
      local_348._M_unused._M_object = (void *)0x0;
      local_348._8_8_ = 0;
      local_1f8 = local_338;
      local_338 = std::
                  _Function_handler<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate.cpp:197:31)>
                  ::_M_manager;
      local_1f0 = p_Stack_330;
      p_Stack_330 = std::
                    _Function_handler<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate.cpp:197:31)>
                    ::_M_invoke;
      if (p_Var2 != (_Manager_type)0x0) {
        (*p_Var2)(&local_208,&local_208,__destroy_functor);
      }
      spvBinaryParse((spv_const_context)local_368,vstate,words,num_words,(spv_parsed_header_fn_t)0x0
                     ,ProcessExtensions,(spv_diagnostic *)0x0);
      sVar5 = spvBinaryParse(context,vstate,words,num_words,(spv_parsed_header_fn_t)0x0,
                             ProcessInstruction,pDiagnostic);
      if (sVar5 == SPV_SUCCESS) {
        local_388 = (Instruction **)0x0;
        iStack_380._M_current = (Instruction **)0x0;
        local_378 = (Instruction **)0x0;
        pIVar18 = (vstate->ordered_instructions_).
                  super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pIVar21 = (vstate->ordered_instructions_).
                  super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        bVar23 = pIVar18 == pIVar21;
        if (bVar23) {
          bVar20 = 1;
          sVar10 = sVar5;
        }
        else {
          local_3a8 = 0;
          local_3a0 = 0;
          local_3c0 = pIVar21;
          local_3b0 = binary;
          do {
            local_3dc = sVar5;
            local_3c8 = pIVar18;
            if ((pIVar18->inst_).opcode == 0xf) {
              uVar7 = Instruction::GetOperandAs<unsigned_int>(pIVar18,1);
              EVar8 = Instruction::GetOperandAs<spv::ExecutionModel>(local_3c8,0);
              local_3b8 = CONCAT44(extraout_var,EVar8);
              Instruction::GetOperandAs<std::__cxx11::string>(&local_2c8,local_3c8,2);
              local_320.name._M_dataplus._M_p = (pointer)&local_320.name.field_2;
              local_320.name._M_string_length = 0;
              local_320.name.field_2._M_local_buf[0] = '\0';
              local_320.interfaces.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
              local_320.interfaces.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_320.interfaces.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish = (uint *)0x0;
              std::__cxx11::string::_M_assign((string *)&local_320);
              psVar14 = (local_3c8->operands_).
                        super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (0x30 < (ulong)((long)(local_3c8->operands_).
                                       super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)psVar14))
              {
                uVar16 = 3;
                lVar15 = 0x30;
                do {
                  uVar1 = (local_3c8->words_).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start
                          [*(ushort *)((long)&psVar14->offset + lVar15)];
                  local_208._0_4_ = uVar1;
                  if (local_320.interfaces.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish ==
                      local_320.interfaces.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                    _M_realloc_insert<unsigned_int>
                              (&local_320.interfaces,
                               (iterator)
                               local_320.interfaces.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish,
                               (uint *)local_208._M_pod_data);
                  }
                  else {
                    *local_320.interfaces.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish = uVar1;
                    local_320.interfaces.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish =
                         local_320.interfaces.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish + 1;
                  }
                  uVar16 = uVar16 + 1;
                  psVar14 = (local_3c8->operands_).
                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  lVar15 = lVar15 + 0x10;
                } while (uVar16 < (ulong)((long)(local_3c8->operands_).
                                                super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)psVar14 >> 4));
              }
              local_398 = pIVar18;
              ValidationState_t::RegisterEntryPoint
                        (vstate,uVar7,(ExecutionModel)local_3b8,&local_320);
              iVar4._M_current = iStack_380._M_current;
              if (iStack_380._M_current == local_388) {
LAB_006348bb:
                pIVar18 = local_398;
                binary = local_3b0;
                if (iStack_380._M_current == local_378) {
                  std::
                  vector<spvtools::val::Instruction*,std::allocator<spvtools::val::Instruction*>>::
                  _M_realloc_insert<spvtools::val::Instruction*const&>
                            ((vector<spvtools::val::Instruction*,std::allocator<spvtools::val::Instruction*>>
                              *)&local_388,iStack_380,&local_3c8);
                }
                else {
                  *iStack_380._M_current = local_3c8;
                  iStack_380._M_current = iStack_380._M_current + 1;
                }
                local_3a8 = CONCAT71((int7)((ulong)local_3a8 >> 8),
                                     (byte)local_3a8 | (uint)local_3b8 - 0x1493 < 2);
                local_3a0 = CONCAT71((int7)((ulong)local_3a0 >> 8),
                                     (byte)local_3a0 | ((uint)local_3b8 & 0xfffffffe) == 0x14f4);
                bVar25 = true;
              }
              else {
                bVar25 = false;
                ppIVar22 = local_388;
                do {
                  pIVar19 = *ppIVar22;
                  bVar24 = false;
                  EVar8 = Instruction::GetOperandAs<spv::ExecutionModel>(pIVar19,0);
                  Instruction::GetOperandAs<std::__cxx11::string>(&local_2e8,pIVar19,2);
                  if (local_2c8._M_string_length == local_2e8._M_string_length) {
                    if (local_2c8._M_string_length == 0) {
                      bVar24 = true;
                    }
                    else {
                      iVar9 = bcmp(local_2c8._M_dataplus._M_p,local_2e8._M_dataplus._M_p,
                                   local_2c8._M_string_length);
                      bVar24 = iVar9 == 0;
                    }
                  }
                  bVar24 = (bool)((ExecutionModel)local_3b8 == EVar8 & bVar24);
                  if (bVar24) {
                    ValidationState_t::diag
                              ((DiagnosticStream *)&local_208,vstate,SPV_ERROR_INVALID_DATA,
                               local_3c8);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_208._M_pod_data,
                               "2 Entry points cannot share the same name and ExecutionMode.",0x3c);
                    local_3dc = local_38;
                    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_208);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
                    operator_delete(local_2e8._M_dataplus._M_p,
                                    local_2e8.field_2._M_allocated_capacity + 1);
                  }
                  if (bVar24) break;
                  ppIVar22 = ppIVar22 + 1;
                  bVar25 = ppIVar22 == iVar4._M_current;
                } while (!bVar25);
                if (bVar25) goto LAB_006348bb;
                bVar25 = false;
                pIVar18 = local_398;
                binary = local_3b0;
              }
              pIVar21 = local_3c0;
              if (local_320.interfaces.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_320.interfaces.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_320.interfaces.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_320.interfaces.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_320.name._M_dataplus._M_p != &local_320.name.field_2) {
                operator_delete(local_320.name._M_dataplus._M_p,
                                CONCAT71(local_320.name.field_2._M_allocated_capacity._1_7_,
                                         local_320.name.field_2._M_local_buf[0]) + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
                operator_delete(local_2c8._M_dataplus._M_p,
                                local_2c8.field_2._M_allocated_capacity + 1);
              }
              if (bVar25) goto LAB_006349b5;
              bVar25 = false;
              sVar5 = local_3dc;
            }
            else {
LAB_006349b5:
              if ((local_3c8->inst_).opcode == 0x39) {
                bVar25 = ValidationState_t::in_function_body(vstate);
                if (!bVar25) {
                  ValidationState_t::diag
                            ((DiagnosticStream *)&local_208,vstate,SPV_ERROR_INVALID_LAYOUT,pIVar18)
                  ;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_208._M_pod_data,
                             "A FunctionCall must happen within a function body.",0x32);
                  sVar5 = local_38;
                  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_208);
                  bVar25 = false;
                  goto LAB_00634ad5;
                }
                uVar7 = Instruction::GetOperandAs<unsigned_int>(local_3c8,2);
                ValidationState_t::AddFunctionCallTarget(vstate,uVar7);
              }
              bVar25 = ValidationState_t::in_function_body(vstate);
              pIVar19 = local_3c8;
              if (bVar25) {
                pFVar12 = ValidationState_t::current_function(vstate);
                pIVar3 = local_3c8;
                pIVar19->function_ = pFVar12;
                pFVar12 = ValidationState_t::current_function(vstate);
                pBVar13 = val::Function::current_block(pFVar12);
                pIVar3->block_ = pBVar13;
                bVar25 = ValidationState_t::in_block(vstate);
                if ((bVar25) &&
                   (bVar25 = spvOpcodeIsBlockTerminator((uint)(local_3c8->inst_).opcode), bVar25)) {
                  pFVar12 = ValidationState_t::current_function(vstate);
                  pBVar13 = val::Function::current_block(pFVar12);
                  pBVar13->terminator_ = local_3c8;
                }
              }
              sVar10 = IdPass(vstate,local_3c8);
              bVar25 = sVar10 == SPV_SUCCESS;
              sVar5 = local_3dc;
              if (!bVar25) {
                sVar5 = sVar10;
              }
            }
LAB_00634ad5:
            sVar10 = sVar5;
            if ((((bVar25) && (sVar10 = CapabilityPass(vstate,pIVar18), sVar10 == SPV_SUCCESS)) &&
                (sVar10 = ModuleLayoutPass(vstate,pIVar18), sVar10 == SPV_SUCCESS)) &&
               ((sVar10 = CfgPass(vstate,pIVar18), sVar10 == SPV_SUCCESS &&
                (sVar10 = InstructionPass(vstate,pIVar18), sVar10 == SPV_SUCCESS)))) {
              ValidationState_t::RegisterInstruction(vstate,pIVar18);
              bVar25 = true;
              pIVar21 = local_3c0;
              if ((pIVar18->inst_).opcode == 0x27) {
                uVar7 = Instruction::GetOperandAs<unsigned_int>(pIVar18,0);
                ValidationState_t::RegisterForwardPointer(vstate,uVar7);
                pIVar21 = local_3c0;
              }
            }
            else {
              bVar25 = false;
              sVar5 = sVar10;
            }
            if (!bVar25) break;
            pIVar18 = pIVar18 + 1;
            bVar23 = pIVar18 == pIVar21;
          } while (!bVar23);
          bVar20 = (byte)local_3a0 & (byte)local_3a8 ^ 1;
          sVar10 = sVar5;
        }
        sVar5 = sVar10;
        if (bVar23) {
          if ((vstate->addressing_model_ == AddressingModelMax) || (vstate->memory_model_ == Max)) {
            ValidationState_t::diag
                      ((DiagnosticStream *)&local_208,vstate,SPV_ERROR_INVALID_LAYOUT,
                       (Instruction *)0x0);
            pcVar17 = "Missing required OpMemoryModel instruction.";
            lVar15 = 0x2b;
LAB_00634c05:
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208._M_pod_data,pcVar17,lVar15);
            sVar5 = local_38;
          }
          else {
            bVar23 = ValidationState_t::in_function_body(vstate);
            if (bVar23) {
              ValidationState_t::diag
                        ((DiagnosticStream *)&local_208,vstate,SPV_ERROR_INVALID_LAYOUT,
                         (Instruction *)0x0);
              pcVar17 = "Missing OpFunctionEnd at end of module.";
              lVar15 = 0x27;
              goto LAB_00634c05;
            }
            bVar23 = EnumSet<spv::Capability>::contains
                               (&vstate->module_capabilities_,BindlessTextureNV);
            if ((bVar23) && (vstate->sampler_image_addressing_mode_ == 0)) {
              ValidationState_t::diag
                        ((DiagnosticStream *)&local_208,vstate,SPV_ERROR_INVALID_LAYOUT,
                         (Instruction *)0x0);
              pcVar17 = "Missing required OpSamplerImageAddressingModeNV instruction.";
              lVar15 = 0x3c;
              goto LAB_00634c05;
            }
            if ((bVar20 & 1) != 0) {
              sVar5 = ValidateForwardDecls(vstate);
              if (sVar5 == SPV_SUCCESS) {
                ReachabilityPass(vstate);
                pIVar19 = (vstate->ordered_instructions_).
                          super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                bVar23 = (vstate->ordered_instructions_).
                         super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
                         ._M_impl.super__Vector_impl_data._M_finish != pIVar19;
                local_3dc = sVar10;
                if ((bVar23) && (local_3dc = UpdateIdUse(vstate,pIVar19), local_3dc == SPV_SUCCESS))
                {
                  lVar15 = 0x88;
                  uVar16 = 0;
                  do {
                    uVar16 = uVar16 + 1;
                    pIVar18 = (vstate->ordered_instructions_).
                              super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    bVar23 = uVar16 < (ulong)(((long)(vstate->ordered_instructions_).
                                                                                                          
                                                  super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                               (long)pIVar18 >> 3) * -0xf0f0f0f0f0f0f0f);
                    local_3dc = sVar10;
                    if (!bVar23) break;
                    pIVar19 = (Instruction *)
                              ((long)&(pIVar18->words_).
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl + lVar15);
                    lVar15 = lVar15 + 0x88;
                    local_3dc = UpdateIdUse(vstate,pIVar19);
                  } while (local_3dc == SPV_SUCCESS);
                }
                sVar5 = local_3dc;
                if (!bVar23) {
                  pIVar18 = (vstate->ordered_instructions_).
                            super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  bVar20 = (vstate->ordered_instructions_).
                           super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
                           ._M_impl.super__Vector_impl_data._M_finish != pIVar18;
                  if ((bool)bVar20) {
                    lVar15 = 0;
                    uVar16 = 0;
                    do {
                      local_3b8 = CONCAT71(local_3b8._1_7_,bVar20);
                      _ = (ValidationState_t *)
                          ((long)&(pIVar18->words_).
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start + lVar15);
                      sVar5 = MiscPass(vstate,(Instruction *)_);
                      if ((((sVar5 == SPV_SUCCESS) &&
                           (sVar5 = DebugPass(vstate,(Instruction *)_), sVar5 == SPV_SUCCESS)) &&
                          (sVar5 = AnnotationPass(vstate,(Instruction *)_), sVar5 == SPV_SUCCESS))
                         && (sVar5 = ExtensionPass(vstate,(Instruction *)_), sVar5 == SPV_SUCCESS))
                      {
                        sVar5 = ModeSettingPass(vstate,(Instruction *)_);
                        if ((((((sVar5 == SPV_SUCCESS) &&
                               (sVar5 = TypePass(vstate,(Instruction *)_), sVar5 == SPV_SUCCESS)) &&
                              ((sVar5 = ConstantPass(vstate,(Instruction *)_), sVar5 == SPV_SUCCESS
                               && ((sVar5 = MemoryPass(vstate,(Instruction *)_),
                                   sVar5 == SPV_SUCCESS &&
                                   (sVar5 = FunctionPass(vstate,(Instruction *)_),
                                   sVar5 == SPV_SUCCESS)))))) &&
                             ((sVar5 = ImagePass(vstate,(Instruction *)_), sVar5 == SPV_SUCCESS &&
                              (((sVar5 = ConversionPass(vstate,(Instruction *)_),
                                sVar5 == SPV_SUCCESS &&
                                (sVar5 = CompositesPass(vstate,(Instruction *)_),
                                sVar5 == SPV_SUCCESS)) &&
                               (sVar5 = ArithmeticsPass(vstate,(Instruction *)_),
                               sVar5 == SPV_SUCCESS)))))) &&
                            ((((sVar5 = BitwisePass(vstate,(Instruction *)_), sVar5 == SPV_SUCCESS
                               && (sVar5 = LogicalsPass(vstate,(Instruction *)_),
                                  sVar5 == SPV_SUCCESS)) &&
                              ((sVar5 = ControlFlowPass(vstate,(Instruction *)_),
                               sVar5 == SPV_SUCCESS &&
                               ((sVar5 = DerivativesPass(vstate,(Instruction *)_),
                                sVar5 == SPV_SUCCESS &&
                                (sVar5 = AtomicsPass(vstate,(Instruction *)_), sVar5 == SPV_SUCCESS)
                                ))))) &&
                             (sVar5 = PrimitivesPass(vstate,(Instruction *)_), sVar5 == SPV_SUCCESS)
                             ))) && ((((((sVar5 = BarriersPass(vstate,(Instruction *)_),
                                         sVar5 == SPV_SUCCESS &&
                                         (sVar5 = NonUniformPass(vstate,(Instruction *)_),
                                         sVar5 == SPV_SUCCESS)) &&
                                        (sVar5 = LiteralsPass(vstate,(Instruction *)_),
                                        sVar5 == SPV_SUCCESS)) &&
                                       ((sVar5 = RayQueryPass(vstate,(Instruction *)_),
                                        sVar5 == SPV_SUCCESS &&
                                        (sVar5 = RayTracingPass(vstate,(Instruction *)_),
                                        sVar5 == SPV_SUCCESS)))) &&
                                      (sVar5 = RayReorderNVPass((val *)vstate,_,inst_00),
                                      sVar5 == SPV_SUCCESS)) &&
                                     (sVar5 = MeshShadingPass(vstate,(Instruction *)_),
                                     sVar5 == SPV_SUCCESS)))) {
                          sVar5 = TensorLayoutPass(vstate,(Instruction *)_);
                          bVar23 = sVar5 == SPV_SUCCESS;
                          if (!bVar23) {
                            local_3dc = sVar5;
                          }
                        }
                        else {
                          local_3dc = sVar5;
                          bVar23 = false;
                        }
                      }
                      else {
                        local_3dc = sVar5;
                        bVar23 = false;
                      }
                      if (!bVar23) {
                        bVar20 = (byte)local_3b8;
                        break;
                      }
                      uVar16 = uVar16 + 1;
                      pIVar18 = (vstate->ordered_instructions_).
                                super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                      lVar15 = lVar15 + 0x88;
                      bVar20 = uVar16 < (ulong)(((long)(vstate->ordered_instructions_).
                                                                                                              
                                                  super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                 (long)pIVar18 >> 3) * -0xf0f0f0f0f0f0f0f);
                    } while ((bool)bVar20);
                  }
                  sVar5 = local_3dc;
                  if (((((bVar20 & 1) == 0) &&
                       (sVar5 = ValidateAdjacency(vstate), sVar5 == SPV_SUCCESS)) &&
                      ((sVar5 = ValidateEntryPoints(vstate), sVar5 == SPV_SUCCESS &&
                       (((sVar5 = PerformCfgChecks(vstate), sVar5 == SPV_SUCCESS &&
                         (sVar5 = CheckIdDefinitionDominateUse(vstate), sVar5 == SPV_SUCCESS)) &&
                        (sVar5 = ValidateDecorations(vstate), sVar5 == SPV_SUCCESS)))))) &&
                     ((sVar5 = ValidateInterfaces(vstate), sVar5 == SPV_SUCCESS &&
                      (sVar5 = ValidateBuiltIns(vstate), sVar5 == SPV_SUCCESS)))) {
                    pIVar3 = (vstate->ordered_instructions_).
                             super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                    for (pIVar19 = (vstate->ordered_instructions_).
                                   super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
                                   ._M_impl.super__Vector_impl_data._M_start; sVar5 = SPV_SUCCESS,
                        pIVar19 != pIVar3; pIVar19 = pIVar19 + 1) {
                      sVar5 = ValidateExecutionLimitations(vstate,pIVar19);
                      if ((sVar5 == SPV_SUCCESS) &&
                         (sVar5 = ValidateSmallTypeUses(vstate,pIVar19), sVar5 == SPV_SUCCESS)) {
                        sVar5 = ValidateQCOMImageProcessingTextureUsages(vstate,pIVar19);
                        bVar23 = sVar5 == SPV_SUCCESS;
                        if (!bVar23) {
                          local_3dc = sVar5;
                        }
                      }
                      else {
                        bVar23 = false;
                        local_3dc = sVar5;
                      }
                      sVar5 = local_3dc;
                      if (!bVar23) break;
                    }
                  }
                }
              }
              goto LAB_00634c5d;
            }
            ValidationState_t::diag
                      ((DiagnosticStream *)&local_208,vstate,SPV_ERROR_INVALID_LAYOUT,
                       (Instruction *)0x0);
            ValidationState_t::VkErrorID_abi_cxx11_(&local_320.name,vstate,0x1bbe,(char *)0x0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208._M_pod_data,local_320.name._M_dataplus._M_p,
                       local_320.name._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208._M_pod_data,
                       "Module can\'t mix MeshEXT/TaskEXT with MeshNV/TaskNV Execution Model.",0x44)
            ;
            sVar5 = local_38;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_320.name._M_dataplus._M_p != &local_320.name.field_2) {
              operator_delete(local_320.name._M_dataplus._M_p,
                              CONCAT71(local_320.name.field_2._M_allocated_capacity._1_7_,
                                       local_320.name.field_2._M_local_buf[0]) + 1);
            }
          }
          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_208);
        }
LAB_00634c5d:
        if (local_388 != (Instruction **)0x0) {
          operator_delete(local_388,(long)local_378 - (long)local_388);
        }
      }
      if (local_338 != (_Manager_type)0x0) {
        (*local_338)(&local_348,&local_348,__destroy_functor);
      }
      goto LAB_00634270;
    }
    local_268 = 0;
    uStack_260 = 0;
    local_258 = 0;
    local_368._0_8_ = local_368 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"");
    position_00.column = uStack_260;
    position_00.line = local_268;
    position_00.index = local_258;
    DiagnosticStream::DiagnosticStream
              ((DiagnosticStream *)&local_208,position_00,&context->consumer,(string *)local_368,
               SPV_ERROR_INVALID_BINARY);
    pcVar17 = "Invalid SPIR-V header.";
    lVar15 = 0x16;
  }
  else {
    local_248 = 0;
    uStack_240 = 0;
    local_238 = 0;
    local_368._0_8_ = local_368 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"");
    position.column = uStack_240;
    position.line = local_248;
    position.index = local_238;
    DiagnosticStream::DiagnosticStream
              ((DiagnosticStream *)&local_208,position,&context->consumer,(string *)local_368,
               SPV_ERROR_INVALID_BINARY);
    pcVar17 = "Invalid SPIR-V magic number.";
    lVar15 = 0x1c;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_208._M_pod_data,pcVar17,lVar15);
  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_208);
  sVar5 = local_38;
  if ((undefined1 *)local_368._0_8_ != local_368 + 0x10) {
    operator_delete((void *)local_368._0_8_,(ulong)(local_368._16_8_ + 1));
  }
LAB_00634270:
  operator_delete(binary,0x10);
  return sVar5;
}

Assistant:

spv_result_t ValidateBinaryUsingContextAndValidationState(
    const spv_context_t& context, const uint32_t* words, const size_t num_words,
    spv_diagnostic* pDiagnostic, ValidationState_t* vstate) {
  auto binary = std::unique_ptr<spv_const_binary_t>(
      new spv_const_binary_t{words, num_words});

  spv_endianness_t endian;
  spv_position_t position = {};
  if (spvBinaryEndianness(binary.get(), &endian)) {
    return DiagnosticStream(position, context.consumer, "",
                            SPV_ERROR_INVALID_BINARY)
           << "Invalid SPIR-V magic number.";
  }

  spv_header_t header;
  if (spvBinaryHeaderGet(binary.get(), endian, &header)) {
    return DiagnosticStream(position, context.consumer, "",
                            SPV_ERROR_INVALID_BINARY)
           << "Invalid SPIR-V header.";
  }

  if (header.version > spvVersionForTargetEnv(context.target_env)) {
    return DiagnosticStream(position, context.consumer, "",
                            SPV_ERROR_WRONG_VERSION)
           << "Invalid SPIR-V binary version "
           << SPV_SPIRV_VERSION_MAJOR_PART(header.version) << "."
           << SPV_SPIRV_VERSION_MINOR_PART(header.version)
           << " for target environment "
           << spvTargetEnvDescription(context.target_env) << ".";
  }

  if (header.bound > vstate->options()->universal_limits_.max_id_bound) {
    return DiagnosticStream(position, context.consumer, "",
                            SPV_ERROR_INVALID_BINARY)
           << "Invalid SPIR-V.  The id bound is larger than the max id bound "
           << vstate->options()->universal_limits_.max_id_bound << ".";
  }

  // Look for OpExtension instructions and register extensions.
  // This parse should not produce any error messages. Hijack the context and
  // replace the message consumer so that we do not pollute any state in input
  // consumer.
  spv_context_t hijacked_context = context;
  hijacked_context.consumer = [](spv_message_level_t, const char*,
                                 const spv_position_t&, const char*) {};
  spvBinaryParse(&hijacked_context, vstate, words, num_words,
                 /* parsed_header = */ nullptr, ProcessExtensions,
                 /* diagnostic = */ nullptr);

  // Parse the module and perform inline validation checks. These checks do
  // not require the knowledge of the whole module.
  if (auto error = spvBinaryParse(&context, vstate, words, num_words,
                                  /*parsed_header =*/nullptr,
                                  ProcessInstruction, pDiagnostic)) {
    return error;
  }

  bool has_mask_task_nv = false;
  bool has_mask_task_ext = false;
  std::vector<Instruction*> visited_entry_points;
  for (auto& instruction : vstate->ordered_instructions()) {
    {
      // In order to do this work outside of Process Instruction we need to be
      // able to, briefly, de-const the instruction.
      Instruction* inst = const_cast<Instruction*>(&instruction);

      if (inst->opcode() == spv::Op::OpEntryPoint) {
        const auto entry_point = inst->GetOperandAs<uint32_t>(1);
        const auto execution_model = inst->GetOperandAs<spv::ExecutionModel>(0);
        const std::string desc_name = inst->GetOperandAs<std::string>(2);

        ValidationState_t::EntryPointDescription desc;
        desc.name = desc_name;

        std::vector<uint32_t> interfaces;
        for (size_t j = 3; j < inst->operands().size(); ++j)
          desc.interfaces.push_back(inst->word(inst->operand(j).offset));

        vstate->RegisterEntryPoint(entry_point, execution_model,
                                   std::move(desc));

        if (visited_entry_points.size() > 0) {
          for (const Instruction* check_inst : visited_entry_points) {
            const auto check_execution_model =
                check_inst->GetOperandAs<spv::ExecutionModel>(0);
            const std::string check_name =
                check_inst->GetOperandAs<std::string>(2);

            if (desc_name == check_name &&
                execution_model == check_execution_model) {
              return vstate->diag(SPV_ERROR_INVALID_DATA, inst)
                     << "2 Entry points cannot share the same name and "
                        "ExecutionMode.";
            }
          }
        }
        visited_entry_points.push_back(inst);

        has_mask_task_nv |= (execution_model == spv::ExecutionModel::TaskNV ||
                             execution_model == spv::ExecutionModel::MeshNV);
        has_mask_task_ext |= (execution_model == spv::ExecutionModel::TaskEXT ||
                              execution_model == spv::ExecutionModel::MeshEXT);
      }
      if (inst->opcode() == spv::Op::OpFunctionCall) {
        if (!vstate->in_function_body()) {
          return vstate->diag(SPV_ERROR_INVALID_LAYOUT, &instruction)
                 << "A FunctionCall must happen within a function body.";
        }

        const auto called_id = inst->GetOperandAs<uint32_t>(2);
        vstate->AddFunctionCallTarget(called_id);
      }

      if (vstate->in_function_body()) {
        inst->set_function(&(vstate->current_function()));
        inst->set_block(vstate->current_function().current_block());

        if (vstate->in_block() && spvOpcodeIsBlockTerminator(inst->opcode())) {
          vstate->current_function().current_block()->set_terminator(inst);
        }
      }

      if (auto error = IdPass(*vstate, inst)) return error;
    }

    if (auto error = CapabilityPass(*vstate, &instruction)) return error;
    if (auto error = ModuleLayoutPass(*vstate, &instruction)) return error;
    if (auto error = CfgPass(*vstate, &instruction)) return error;
    if (auto error = InstructionPass(*vstate, &instruction)) return error;

    // Now that all of the checks are done, update the state.
    {
      Instruction* inst = const_cast<Instruction*>(&instruction);
      vstate->RegisterInstruction(inst);
      if (inst->opcode() == spv::Op::OpTypeForwardPointer) {
        vstate->RegisterForwardPointer(inst->GetOperandAs<uint32_t>(0));
      }
    }
  }

  if (!vstate->has_memory_model_specified())
    return vstate->diag(SPV_ERROR_INVALID_LAYOUT, nullptr)
           << "Missing required OpMemoryModel instruction.";

  if (vstate->in_function_body())
    return vstate->diag(SPV_ERROR_INVALID_LAYOUT, nullptr)
           << "Missing OpFunctionEnd at end of module.";

  if (vstate->HasCapability(spv::Capability::BindlessTextureNV) &&
      !vstate->has_samplerimage_variable_address_mode_specified())
    return vstate->diag(SPV_ERROR_INVALID_LAYOUT, nullptr)
           << "Missing required OpSamplerImageAddressingModeNV instruction.";

  if (has_mask_task_ext && has_mask_task_nv)
    return vstate->diag(SPV_ERROR_INVALID_LAYOUT, nullptr)
           << vstate->VkErrorID(7102)
           << "Module can't mix MeshEXT/TaskEXT with MeshNV/TaskNV Execution "
              "Model.";

  // Catch undefined forward references before performing further checks.
  if (auto error = ValidateForwardDecls(*vstate)) return error;

  // Calculate reachability after all the blocks are parsed, but early that it
  // can be relied on in subsequent pases.
  ReachabilityPass(*vstate);

  // ID usage needs be handled in its own iteration of the instructions,
  // between the two others. It depends on the first loop to have been
  // finished, so that all instructions have been registered. And the following
  // loop depends on all of the usage data being populated. Thus it cannot live
  // in either of those iterations.
  // It should also live after the forward declaration check, since it will
  // have problems with missing forward declarations, but give less useful error
  // messages.
  for (size_t i = 0; i < vstate->ordered_instructions().size(); ++i) {
    auto& instruction = vstate->ordered_instructions()[i];
    if (auto error = UpdateIdUse(*vstate, &instruction)) return error;
  }

  // Validate individual opcodes.
  for (size_t i = 0; i < vstate->ordered_instructions().size(); ++i) {
    auto& instruction = vstate->ordered_instructions()[i];

    // Keep these passes in the order they appear in the SPIR-V specification
    // sections to maintain test consistency.
    if (auto error = MiscPass(*vstate, &instruction)) return error;
    if (auto error = DebugPass(*vstate, &instruction)) return error;
    if (auto error = AnnotationPass(*vstate, &instruction)) return error;
    if (auto error = ExtensionPass(*vstate, &instruction)) return error;
    if (auto error = ModeSettingPass(*vstate, &instruction)) return error;
    if (auto error = TypePass(*vstate, &instruction)) return error;
    if (auto error = ConstantPass(*vstate, &instruction)) return error;
    if (auto error = MemoryPass(*vstate, &instruction)) return error;
    if (auto error = FunctionPass(*vstate, &instruction)) return error;
    if (auto error = ImagePass(*vstate, &instruction)) return error;
    if (auto error = ConversionPass(*vstate, &instruction)) return error;
    if (auto error = CompositesPass(*vstate, &instruction)) return error;
    if (auto error = ArithmeticsPass(*vstate, &instruction)) return error;
    if (auto error = BitwisePass(*vstate, &instruction)) return error;
    if (auto error = LogicalsPass(*vstate, &instruction)) return error;
    if (auto error = ControlFlowPass(*vstate, &instruction)) return error;
    if (auto error = DerivativesPass(*vstate, &instruction)) return error;
    if (auto error = AtomicsPass(*vstate, &instruction)) return error;
    if (auto error = PrimitivesPass(*vstate, &instruction)) return error;
    if (auto error = BarriersPass(*vstate, &instruction)) return error;
    // Group
    // Device-Side Enqueue
    // Pipe
    if (auto error = NonUniformPass(*vstate, &instruction)) return error;

    if (auto error = LiteralsPass(*vstate, &instruction)) return error;
    if (auto error = RayQueryPass(*vstate, &instruction)) return error;
    if (auto error = RayTracingPass(*vstate, &instruction)) return error;
    if (auto error = RayReorderNVPass(*vstate, &instruction)) return error;
    if (auto error = MeshShadingPass(*vstate, &instruction)) return error;
    if (auto error = TensorLayoutPass(*vstate, &instruction)) return error;
  }

  // Validate the preconditions involving adjacent instructions. e.g.
  // spv::Op::OpPhi must only be preceded by spv::Op::OpLabel, spv::Op::OpPhi,
  // or spv::Op::OpLine.
  if (auto error = ValidateAdjacency(*vstate)) return error;

  if (auto error = ValidateEntryPoints(*vstate)) return error;
  // CFG checks are performed after the binary has been parsed
  // and the CFGPass has collected information about the control flow
  if (auto error = PerformCfgChecks(*vstate)) return error;
  if (auto error = CheckIdDefinitionDominateUse(*vstate)) return error;
  if (auto error = ValidateDecorations(*vstate)) return error;
  if (auto error = ValidateInterfaces(*vstate)) return error;
  // TODO(dsinclair): Restructure ValidateBuiltins so we can move into the
  // for() above as it loops over all ordered_instructions internally.
  if (auto error = ValidateBuiltIns(*vstate)) return error;
  // These checks must be performed after individual opcode checks because
  // those checks register the limitation checked here.
  for (const auto& inst : vstate->ordered_instructions()) {
    if (auto error = ValidateExecutionLimitations(*vstate, &inst)) return error;
    if (auto error = ValidateSmallTypeUses(*vstate, &inst)) return error;
    if (auto error = ValidateQCOMImageProcessingTextureUsages(*vstate, &inst))
      return error;
  }

  return SPV_SUCCESS;
}